

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCompileFail.cpp
# Opt level: O0

void TEST_FOR_FAIL_FULL(char *name,char *str,char *error)

{
  int iVar1;
  char *__src;
  char local_1028 [8];
  char buf [4096];
  nullres good;
  char *error_local;
  char *str_local;
  char *name_local;
  
  testsCount[4] = testsCount[4] + 1;
  buf[0xfff] = nullcCompile(str);
  if (buf[0xfff] == '\0') {
    __src = nullcGetLastError();
    strncpy(local_1028,__src,0xfff);
    buf[0xff7] = '\0';
    iVar1 = strcmp(error,local_1028);
    if (iVar1 == 0) {
      testsPassed[4] = testsPassed[4] + 1;
    }
    else {
      printf("Failed %s but for wrong reason:\r\n    %s\r\nexpected:\r\n    %s\r\n",name,local_1028,
             error);
    }
  }
  else {
    printf("Test \"%s\" failed to fail.\r\n",name);
  }
  return;
}

Assistant:

void TEST_FOR_FAIL_FULL(const char* name, const char* str, const char* error)
{
	testsCount[TEST_TYPE_FAILURE]++;
	nullres good = nullcCompile(str);
	if(!good)
	{
		char buf[4096];
		strncpy(buf, nullcGetLastError(), 4095); buf[4095] = 0;
		if(strcmp(error, buf) != 0)
		{
			printf("Failed %s but for wrong reason:\r\n    %s\r\nexpected:\r\n    %s\r\n", name, buf, error);
		}else{
			testsPassed[TEST_TYPE_FAILURE]++;
		}
	}else{
		printf("Test \"%s\" failed to fail.\r\n", name);
	}
}